

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnd.h
# Opt level: O3

unsigned_long_long rnd_xorshift_next(rnd_xorshift_t *xorshift)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = xorshift->state[0];
  uVar1 = xorshift->state[1];
  xorshift->state[0] = uVar1;
  uVar2 = uVar2 << 0x17 ^ uVar2;
  uVar2 = uVar2 >> 0x11 ^ uVar1 >> 0x1a ^ uVar1 ^ uVar2;
  xorshift->state[1] = uVar2;
  return uVar2 + uVar1;
}

Assistant:

RND_U64 rnd_xorshift_next( rnd_xorshift_t* xorshift )
    {
    RND_U64 x = xorshift->state[ 0 ];
    RND_U64 const y = xorshift->state[ 1 ];
    xorshift->state[ 0 ] = y;
    x ^= x << 23;
    x ^= x >> 17;
    x ^= y ^ ( y >> 26 );
    xorshift->state[ 1 ] = x;
    return x + y;
    }